

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::UpdateWitnessStackRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateWitnessStackRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_6f0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_638 [4];
  JsonClassBase<cfd::js::api::json::RawTransactionResponse> local_618 [4];
  undefined1 local_5f8 [8];
  RawTransactionResponse res_2;
  undefined1 local_598 [8];
  RawTransactionResponseStruct response;
  UpdateWitnessStackRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_190 [8];
  UpdateWitnessStackRequest req;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txin_.witness_stack_._168_8_ = call_function;
  UpdateWitnessStackRequest::UpdateWitnessStackRequest((UpdateWitnessStackRequest *)local_190);
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest> *)local_190,
             request_message);
  UpdateWitnessStackRequest::ConvertToStruct
            ((UpdateWitnessStackRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (UpdateWitnessStackRequest *)local_190);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
  ::operator()((RawTransactionResponseStruct *)local_598,call_function,
               (UpdateWitnessStackRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_5f8);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_5f8,(RawTransactionResponseStruct *)local_598);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_(local_618)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_618);
    std::__cxx11::string::~string((string *)local_618);
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_5f8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_6f0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_638);
    std::__cxx11::string::operator=((string *)this,(string *)local_638);
    std::__cxx11::string::~string((string *)local_638);
    ErrorResponse::~ErrorResponse(&local_6f0);
  }
  res_2._87_1_ = 1;
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_598);
  UpdateWitnessStackRequestStruct::~UpdateWitnessStackRequestStruct
            ((UpdateWitnessStackRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  UpdateWitnessStackRequest::~UpdateWitnessStackRequest((UpdateWitnessStackRequest *)local_190);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}